

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal-pending-on-close.c
# Opt level: O0

int run_test_signal_pending_on_close(void)

{
  int iVar1;
  undefined1 auVar2 [16];
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  void *eval_b_6;
  void *eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 uStack_28;
  int r;
  uv_buf_t buffer;
  int pipefds [2];
  
  iVar1 = uv_loop_init(&loop);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x41,"uv_loop_init(&loop)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_signal_init(&loop,&signal_hdl);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x43,"uv_signal_init(&loop, &signal_hdl)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_signal_start(&signal_hdl,signal_cb,0xd);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x45,"uv_signal_start(&signal_hdl, signal_cb, 13)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = pipe((int *)&buffer.len);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x47,"pipe(pipefds)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_init(&loop,&pipe_hdl,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x49,"uv_pipe_init(&loop, &pipe_hdl, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_open(&pipe_hdl,buffer.len._4_4_);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x4b,"uv_pipe_open(&pipe_hdl, pipefds[1])","==","0",(long)iVar1,"==",0);
    abort();
  }
  buf = (char *)malloc(0x1000000);
  if (buf == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x4f,"buf","!=","NULL",0,"!=",0);
    abort();
  }
  memset(buf,0x2e,0x1000000);
  auVar2 = uv_buf_init(buf,0x1000000);
  buffer.base = auVar2._8_8_;
  uStack_28 = auVar2._0_8_;
  iVar1 = uv_write(&write_req,&pipe_hdl,&stack0xffffffffffffffd8,1,write_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x54,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  close((int)buffer.len);
  iVar1 = uv_run(&loop,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x59,"uv_run(&loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x5b,"2","==","close_cb_called",2,"==",(long)close_cb_called);
    abort();
  }
  close_loop(&loop);
  iVar1 = uv_loop_close(&loop);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x5d,"0","==","uv_loop_close(&loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(signal_pending_on_close) {
  int pipefds[2];
  uv_buf_t buffer;
  int r;

  ASSERT_OK(uv_loop_init(&loop));

  ASSERT_OK(uv_signal_init(&loop, &signal_hdl));

  ASSERT_OK(uv_signal_start(&signal_hdl, signal_cb, SIGPIPE));

  ASSERT_OK(pipe(pipefds));

  ASSERT_OK(uv_pipe_init(&loop, &pipe_hdl, 0));

  ASSERT_OK(uv_pipe_open(&pipe_hdl, pipefds[1]));

  /* Write data large enough so it needs loop iteration */
  buf = malloc(1<<24);
  ASSERT_NOT_NULL(buf);
  memset(buf, '.', 1<<24);
  buffer = uv_buf_init(buf, 1<<24);

  r = uv_write(&write_req, (uv_stream_t *) &pipe_hdl, &buffer, 1, write_cb);
  ASSERT_OK(r);

  /* cause a SIGPIPE on write in next iteration */
  close(pipefds[0]);

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));

  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}